

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char * apprun_string_trim(char *str)

{
  ushort **ppuVar1;
  char *pcVar2;
  bool bVar3;
  char *result;
  char *useful_section_end;
  char *useful_section_start;
  char *str_local;
  
  useful_section_end = str;
  while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*useful_section_end] & 0x2000) != 0) {
    useful_section_end = useful_section_end + 1;
  }
  for (result = useful_section_end; *result != '\0'; result = result + 1) {
  }
  while( true ) {
    bVar3 = false;
    if (useful_section_end < result + -1) {
      ppuVar1 = __ctype_b_loc();
      bVar3 = ((*ppuVar1)[(int)result[-1]] & 0x2000) != 0;
    }
    if (!bVar3) break;
    result = result + -1;
  }
  pcVar2 = strndup(useful_section_end,(long)result - (long)useful_section_end);
  return pcVar2;
}

Assistant:

char *apprun_string_trim(char *str) {
    char *useful_section_start = str;

    while (isspace(*useful_section_start))
        useful_section_start++;

    char *useful_section_end = useful_section_start;
    while (*useful_section_end != '\0')
        useful_section_end++;

    while (((useful_section_end - 1) > useful_section_start) && isspace(*(useful_section_end - 1)))
        useful_section_end--;

    char *result = strndup(useful_section_start, useful_section_end - useful_section_start);
    return result;
}